

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

int unescapestring(char *dst,char *src,char *end)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  
  iVar4 = (int)dst;
  do {
    if (end <= src) break;
    pcVar3 = src + 1;
    cVar2 = *src;
    if (cVar2 == '^') {
      if (pcVar3 < end) {
        cVar2 = src[1];
        pcVar3 = src + 2;
        if (cVar2 == 'f') {
          cVar2 = '\f';
        }
        else if (cVar2 == 'n') {
          cVar2 = '\n';
        }
        else if (cVar2 == 't') {
          cVar2 = '\t';
        }
        goto LAB_00127bb2;
      }
      bVar1 = false;
    }
    else {
LAB_00127bb2:
      *dst = cVar2;
      dst = dst + 1;
      bVar1 = true;
    }
    src = pcVar3;
  } while (bVar1);
  return (int)dst - iVar4;
}

Assistant:

int unescapestring(char *dst, const char *src, const char *end)
{
    char *start = dst;
    while(src < end)
    {
        int c = *src++;
        if(c == '^')
        {
            if(src >= end) break;
            int e = *src++;
            switch(e)
            {
                case 'n': *dst++ = '\n'; break;
                case 't': *dst++ = '\t'; break;
                case 'f': *dst++ = '\f'; break;
                default: *dst++ = e; break;
            }
        }
        else *dst++ = c;
    }
    return dst - start;
}